

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

int __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,256,false>>
::
linear_search_plain_compare<S2ClosestCellQueryBase<S2MinDistance>::Result,std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>>
          (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,256,false>>
           *this,Result *k,int s,int e,less<S2ClosestCellQueryBase<S2MinDistance>::Result> *comp)

{
  bool bVar1;
  key_type *__x;
  less<S2ClosestCellQueryBase<S2MinDistance>::Result> *comp_local;
  int e_local;
  int s_local;
  Result *k_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *this_local;
  
  comp_local._4_4_ = s;
  while( true ) {
    if (e <= comp_local._4_4_) {
      return comp_local._4_4_;
    }
    __x = btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
          ::key((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 *)this,comp_local._4_4_);
    bVar1 = std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>::operator()(comp,__x,k);
    if (!bVar1) break;
    comp_local._4_4_ = comp_local._4_4_ + 1;
  }
  return comp_local._4_4_;
}

Assistant:

int linear_search_plain_compare(const K &k, int s, const int e,
                                  const Compare &comp) const {
    while (s < e) {
      if (!comp(key(s), k)) {
        break;
      }
      ++s;
    }
    return s;
  }